

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdswitch.c
# Opt level: O1

boolean set_sample_factors(j_compress_ptr cinfo,char *arg)

{
  char cVar1;
  jpeg_component_info *pjVar2;
  int iVar3;
  long lVar4;
  char ch2;
  char ch1;
  int val2;
  int val1;
  char local_3a;
  byte local_39;
  int local_38;
  int local_34;
  
  lVar4 = 0;
  do {
    if (*arg == '\0') {
      pjVar2 = cinfo->comp_info;
      pjVar2[lVar4].h_samp_factor = 1;
      pjVar2[lVar4].v_samp_factor = 1;
    }
    else {
      local_3a = ',';
      iVar3 = __isoc99_sscanf(arg,"%d%c%d%c",&local_34,&local_39,&local_38,&local_3a);
      if (iVar3 < 3) {
        return 0;
      }
      if ((local_39 & 0xdf) != 0x58) {
        return 0;
      }
      if (local_3a != ',') {
        return 0;
      }
      if ((local_34 - 5U < 0xfffffffc) || (local_38 - 5U < 0xfffffffc)) {
        set_sample_factors_cold_1();
        return 0;
      }
      pjVar2 = cinfo->comp_info;
      pjVar2[lVar4].h_samp_factor = local_34;
      pjVar2[lVar4].v_samp_factor = local_38;
      do {
        cVar1 = *arg;
        if (cVar1 == '\0') break;
        arg = arg + 1;
      } while (cVar1 != ',');
    }
    lVar4 = lVar4 + 1;
    if (lVar4 == 10) {
      return 1;
    }
  } while( true );
}

Assistant:

GLOBAL(boolean)
set_sample_factors(j_compress_ptr cinfo, char *arg)
/* Process a sample-factors parameter string, of the form
 *     HxV[,HxV,...]
 * If there are more components than parameters, "1x1" is assumed for the rest.
 */
{
  int ci, val1, val2;
  char ch1, ch2;

  for (ci = 0; ci < MAX_COMPONENTS; ci++) {
    if (*arg) {
      ch2 = ',';                /* if not set by sscanf, will be ',' */
      if (sscanf(arg, "%d%c%d%c", &val1, &ch1, &val2, &ch2) < 3)
        return FALSE;
      if ((ch1 != 'x' && ch1 != 'X') || ch2 != ',') /* syntax check */
        return FALSE;
      if (val1 <= 0 || val1 > 4 || val2 <= 0 || val2 > 4) {
        fprintf(stderr, "JPEG sampling factors must be 1..4\n");
        return FALSE;
      }
      cinfo->comp_info[ci].h_samp_factor = val1;
      cinfo->comp_info[ci].v_samp_factor = val2;
      while (*arg && *arg++ != ',');  /* advance to next segment of arg
                                         string */
    } else {
      /* reached end of parameter, set remaining components to 1x1 sampling */
      cinfo->comp_info[ci].h_samp_factor = 1;
      cinfo->comp_info[ci].v_samp_factor = 1;
    }
  }
  return TRUE;
}